

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O1

void __thiscall
CreditCard::CreditCard
          (CreditCard *this,int id,int sender,int receiver,double amount,string *cardNumber,
          string *expirationDate,string *cvv)

{
  Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_00109d10;
  (this->cardNumber)._M_dataplus._M_p = (pointer)&(this->cardNumber).field_2;
  (this->cardNumber)._M_string_length = 0;
  (this->cardNumber).field_2._M_local_buf[0] = '\0';
  (this->expirationDate)._M_dataplus._M_p = (pointer)&(this->expirationDate).field_2;
  (this->expirationDate)._M_string_length = 0;
  (this->expirationDate).field_2._M_local_buf[0] = '\0';
  (this->cvv)._M_dataplus._M_p = (pointer)&(this->cvv).field_2;
  (this->cvv)._M_string_length = 0;
  (this->cvv).field_2._M_local_buf[0] = '\0';
  (this->super_Transaction).id = id;
  (this->super_Transaction).sender = sender;
  (this->super_Transaction).receiver = receiver;
  (this->super_Transaction).amount = amount;
  std::__cxx11::string::_M_assign((string *)&this->cardNumber);
  std::__cxx11::string::_M_assign((string *)&this->expirationDate);
  std::__cxx11::string::_M_assign((string *)&this->cvv);
  return;
}

Assistant:

CreditCard::CreditCard(int id, int sender, int receiver, double amount, string cardNumber, string expirationDate, string cvv)
{
    this->id = id;
    this->sender = sender;
    this->receiver = receiver;
    this->amount = amount;
    this->cardNumber = cardNumber;
    this->expirationDate = expirationDate;
    this->cvv = cvv;
}